

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

void __thiscall pbrt::PixelStatsAccumulator::PixelStatsAccumulator(PixelStatsAccumulator *this)

{
  PixelStats *this_00;
  undefined8 *in_RDI;
  
  *in_RDI = 0;
  this_00 = (PixelStats *)operator_new(0x178);
  PixelStats::PixelStats(this_00);
  *in_RDI = this_00;
  return;
}

Assistant:

PixelStatsAccumulator::PixelStatsAccumulator() {
    stats = new PixelStats;
}